

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

uint ** __thiscall
Memory::AllocateArray<Memory::JitArenaAllocator,unsigned_int*,false>
          (Memory *this,JitArenaAllocator *allocator,offset_in_JitArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  uint **ppuVar1;
  
  if (count != 0) {
    ppuVar1 = (uint **)new__<Memory::JitArenaAllocator>
                                 (-(ulong)(count >> 0x3d != 0) | count << 3,
                                  (JitArenaAllocator *)this,
                                  (offset_in_JitArenaAllocator_to_subr)allocator);
    return ppuVar1;
  }
  return (uint **)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}